

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *pFVar1;
  FieldDescriptor *field;
  long *plVar2;
  pointer pcVar3;
  ImmutableMessageLiteGenerator *pIVar4;
  bool bVar5;
  int iVar6;
  ImmutableFieldLiteGenerator *pIVar7;
  Descriptor *pDVar8;
  OneofGeneratorInfo *pOVar9;
  size_type sVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  uint uVar12;
  OneofDescriptor *oneof;
  long lVar13;
  ImmutableMessageLiteGenerator *pIVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  string local_68;
  ImmutableMessageLiteGenerator *local_48;
  long local_40;
  long local_38;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_68,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "Visitor visitor = (Visitor) arg0;\n$classname$ other = ($classname$) arg1;\n",
                     "classname",&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pDVar8 = (this->super_MessageGenerator).descriptor_;
  local_48 = this;
  if (0 < *(int *)(pDVar8 + 0x2c)) {
    lVar17 = 0;
    lVar13 = 0;
    do {
      if (*(long *)(*(long *)(pDVar8 + 0x30) + 0x60 + lVar17) == 0) {
        pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                 get(&this->field_generators_,(FieldDescriptor *)(*(long *)(pDVar8 + 0x30) + lVar17)
                    );
        (*pIVar7->_vptr_ImmutableFieldLiteGenerator[8])(pIVar7,printer);
        pDVar8 = (local_48->super_MessageGenerator).descriptor_;
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar13 < *(int *)(pDVar8 + 0x2c));
  }
  pIVar14 = local_48;
  if (0 < *(int *)(pDVar8 + 0x38)) {
    pFVar1 = &local_48->field_generators_;
    lVar13 = 0;
    do {
      lVar16 = lVar13 * 0x30;
      pOVar9 = Context::GetOneofGeneratorInfo
                         (pIVar14->context_,(OneofDescriptor *)(*(long *)(pDVar8 + 0x40) + lVar16));
      io::Printer::Print(printer,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                         "oneof_capitalized_name",&pOVar9->capitalized_name);
      io::Printer::Indent(printer);
      lVar17 = *(long *)((pIVar14->super_MessageGenerator).descriptor_ + 0x40);
      local_38 = lVar13 * 3;
      if (*(int *)(lVar17 + 0x1c + lVar16) < 1) {
        oneof = (OneofDescriptor *)(lVar17 + lVar16);
      }
      else {
        lVar16 = lVar13 * 0x30;
        lVar18 = 0;
        local_40 = lVar13;
        do {
          field = *(FieldDescriptor **)(*(long *)(lVar17 + 0x20 + lVar16) + lVar18 * 8);
          plVar2 = *(long **)field;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          lVar13 = *plVar2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_68,lVar13,plVar2[1] + lVar13);
          if (local_68._M_string_length != 0) {
            sVar10 = 0;
            do {
              if ((byte)(local_68._M_dataplus._M_p[sVar10] + 0x9fU) < 0x1a) {
                local_68._M_dataplus._M_p[sVar10] = local_68._M_dataplus._M_p[sVar10] + -0x20;
              }
              sVar10 = sVar10 + 1;
            } while (local_68._M_string_length != sVar10);
          }
          io::Printer::Print(printer,"case $field_name$: {\n","field_name",&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                   ::get(pFVar1,field);
          (*pIVar7->_vptr_ImmutableFieldLiteGenerator[8])(pIVar7,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar18 = lVar18 + 1;
          lVar17 = *(long *)((local_48->super_MessageGenerator).descriptor_ + 0x40);
        } while (lVar18 < *(int *)(lVar17 + 0x1c + lVar16));
        oneof = (OneofDescriptor *)(lVar17 + lVar16);
        pIVar14 = local_48;
        lVar13 = local_40;
      }
      pOVar9 = Context::GetOneofGeneratorInfo(pIVar14->context_,oneof);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar3 = (pOVar9->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (pOVar9->name)._M_string_length);
      if (local_68._M_string_length != 0) {
        sVar10 = 0;
        do {
          if ((byte)(local_68._M_dataplus._M_p[sVar10] + 0x9fU) < 0x1a) {
            local_68._M_dataplus._M_p[sVar10] = local_68._M_dataplus._M_p[sVar10] + -0x20;
          }
          sVar10 = sVar10 + 1;
        } while (local_68._M_string_length != sVar10);
      }
      pOVar9 = Context::GetOneofGeneratorInfo
                         (pIVar14->context_,
                          (OneofDescriptor *)
                          (local_38 * 0x10 +
                          *(long *)((pIVar14->super_MessageGenerator).descriptor_ + 0x40)));
      io::Printer::Print(printer,
                         "case $cap_oneof_name$_NOT_SET: {\n  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n  break;\n}\n"
                         ,"cap_oneof_name",&local_68,"oneof_name",&pOVar9->name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      lVar13 = lVar13 + 1;
      pDVar8 = (pIVar14->super_MessageGenerator).descriptor_;
    } while (lVar13 < *(int *)(pDVar8 + 0x38));
  }
  io::Printer::Print(printer,
                     "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n    .INSTANCE) {\n"
                    );
  io::Printer::Indent(printer);
  pIVar4 = local_48;
  pDVar8 = (pIVar14->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar8 + 0x38)) {
    lVar17 = 0;
    lVar13 = 0;
    do {
      pOVar9 = Context::GetOneofGeneratorInfo
                         (pIVar4->context_,(OneofDescriptor *)(*(long *)(pDVar8 + 0x40) + lVar17));
      io::Printer::Print(printer,
                         "if (other.$oneof_name$Case_ != 0) {\n  $oneof_name$Case_ = other.$oneof_name$Case_;\n}\n"
                         ,"oneof_name",&pOVar9->name);
      lVar13 = lVar13 + 1;
      pDVar8 = (pIVar4->super_MessageGenerator).descriptor_;
      lVar17 = lVar17 + 0x30;
    } while (lVar13 < *(int *)(pDVar8 + 0x38));
  }
  if (*(int *)(*(long *)(pDVar8 + 0x10) + 0x8c) == 3) {
    bVar5 = HasRepeatedFields(pDVar8);
    if (!bVar5) goto LAB_00275fb4;
    pDVar8 = (local_48->super_MessageGenerator).descriptor_;
  }
  pIVar14 = local_48;
  if (0 < *(int *)(pDVar8 + 0x2c)) {
    pFVar1 = &local_48->field_generators_;
    lVar17 = 0;
    lVar13 = 0;
    iVar15 = 0;
    do {
      pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (pFVar1,(FieldDescriptor *)(*(long *)(pDVar8 + 0x30) + lVar17));
      iVar6 = (*pIVar7->_vptr_ImmutableFieldLiteGenerator[2])(pIVar7);
      iVar15 = iVar15 + iVar6;
      lVar13 = lVar13 + 1;
      pDVar8 = (pIVar14->super_MessageGenerator).descriptor_;
      lVar17 = lVar17 + 0xa8;
    } while (lVar13 < *(int *)(pDVar8 + 0x2c));
    if (0 < iVar15) {
      uVar12 = 0;
      uVar11 = extraout_RDX;
      do {
        GetBitFieldName_abi_cxx11_(&local_68,(java *)(ulong)uVar12,(int)uVar11);
        io::Printer::Print(printer,"$bit_field_name$ |= other.$bit_field_name$;\n","bit_field_name",
                           &local_68);
        uVar11 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          uVar11 = extraout_RDX_01;
        }
        uVar12 = uVar12 + 1;
      } while (iVar15 + 0x1fU >> 5 != uVar12);
    }
  }
LAB_00275fb4:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Print(printer,"return this;\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit(
    io::Printer* printer) {
  printer->Print(
    "Visitor visitor = (Visitor) arg0;\n"
    "$classname$ other = ($classname$) arg1;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(
          descriptor_->field(i)).GenerateVisitCode(printer);
    }
  }

  // Merge oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
      "switch (other.get$oneof_capitalized_name$Case()) {\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_name$: {\n",
        "field_name",
        ToUpper(field->name()));
      printer->Indent();
      field_generators_.get(field).GenerateVisitCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
      "case $cap_oneof_name$_NOT_SET: {\n"
      "  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n"
      "  break;\n"
      "}\n",
      "cap_oneof_name",
      ToUpper(context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name),
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n"
    "    .INSTANCE) {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    const OneofDescriptor* field = descriptor_->oneof_decl(i);
    printer->Print(
      "if (other.$oneof_name$Case_ != 0) {\n"
      "  $oneof_name$Case_ = other.$oneof_name$Case_;\n"
      "}\n",
      "oneof_name", context_->GetOneofGeneratorInfo(field)->name);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;

    for (int i = 0; i < totalInts; i++) {
      printer->Print(
        "$bit_field_name$ |= other.$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }
  printer->Outdent();
  printer->Print(
    "}\n");


  printer->Print(
    "return this;\n");
}